

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

int __thiscall
soplex::CLUFactor<double>::vSolveLeft3
          (CLUFactor<double> *this,double eps,double *vec,int *idx,double *rhs,int *ridx,int rn,
          double *vec2,double *rhs2,int *ridx2,int rn2,double *vec3,double *rhs3,int *ridx3,int rn3)

{
  int iVar1;
  long in_RDI;
  double *in_stack_00000008;
  undefined4 in_stack_00000010;
  double *in_stack_00000048;
  undefined4 in_stack_0000006c;
  
  if (*(int *)(in_RDI + 0xa0) == 0) {
    solveUpdateLeft(this,eps,vec,idx,rhs._4_4_);
    solveUleft((CLUFactor<double> *)vec3,(double)CONCAT44(in_stack_0000006c,rn2),(double *)ridx2,
               (int *)rhs2,vec2,(int *)in_stack_00000048,this._4_4_);
    solveUpdateLeft(this,eps,vec,idx,rhs._4_4_);
    solveUleftNoNZ((CLUFactor<double> *)ridx2,(double)rhs2,vec2,in_stack_00000048,(int *)this,
                   eps._4_4_);
    iVar1 = solveUpdateLeft(this,eps,vec,idx,rhs._4_4_);
    this = (CLUFactor<double> *)CONCAT44(this._4_4_,iVar1);
    solveUleftNoNZ((CLUFactor<double> *)ridx2,(double)rhs2,vec2,in_stack_00000048,
                   (int *)CONCAT44(this._4_4_,iVar1),eps._4_4_);
  }
  else {
    solveUleft((CLUFactor<double> *)vec3,(double)CONCAT44(in_stack_0000006c,rn2),(double *)ridx2,
               (int *)rhs2,vec2,(int *)in_stack_00000048,this._4_4_);
    solveLleftForest(this,eps,vec,idx,rhs._4_4_);
    solveUleftNoNZ((CLUFactor<double> *)ridx2,(double)rhs2,vec2,in_stack_00000048,(int *)this,
                   eps._4_4_);
    solveLleftForestNoNZ((CLUFactor<double> *)CONCAT44(rn,in_stack_00000010),in_stack_00000008);
    solveUleftNoNZ((CLUFactor<double> *)ridx2,(double)rhs2,vec2,in_stack_00000048,(int *)this,
                   eps._4_4_);
    solveLleftForestNoNZ((CLUFactor<double> *)CONCAT44(rn,in_stack_00000010),in_stack_00000008);
  }
  iVar1 = solveLleft((CLUFactor<double> *)vec2,(double)in_stack_00000048,(double *)this,(int *)eps,
                     vec._4_4_);
  solveLleftNoNZ((CLUFactor<double> *)CONCAT44(rn,in_stack_00000010),in_stack_00000008);
  solveLleftNoNZ((CLUFactor<double> *)CONCAT44(rn,in_stack_00000010),in_stack_00000008);
  return iVar1;
}

Assistant:

int CLUFactor<R>::vSolveLeft3(R eps,
                              R* vec, int* idx,                      /* result */
                              R* rhs, int* ridx, int rn,             /* rhs    */
                              R* vec2,                               /* result2 */
                              R* rhs2, int* ridx2, int rn2,          /* rhs2    */
                              R* vec3,                               /* result3 */
                              R* rhs3, int* ridx3, int rn3)          /* rhs3    */
{

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = solveUpdateLeft(eps, rhs, ridx, rn);
      rn = solveUleft(eps, vec, idx, rhs, ridx, rn);
      rn2 = solveUpdateLeft(eps, rhs2, ridx2, rn2);
      solveUleftNoNZ(eps, vec2, rhs2, ridx2, rn2);
      rn3 = solveUpdateLeft(eps, rhs3, ridx3, rn3);
      solveUleftNoNZ(eps, vec3, rhs3, ridx3, rn3);
   }
   else
   {
      rn = solveUleft(eps, vec, idx, rhs, ridx, rn);
      rn = solveLleftForest(eps, vec, idx, rn);
      solveUleftNoNZ(eps, vec2, rhs2, ridx2, rn2);
      solveLleftForestNoNZ(vec2);
      solveUleftNoNZ(eps, vec3, rhs3, ridx3, rn3);
      solveLleftForestNoNZ(vec3);
   }

   rn = solveLleft(eps, vec, idx, rn);

   solveLleftNoNZ(vec2);
   solveLleftNoNZ(vec3);

   return rn;
}